

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators-inl.h
# Opt level: O1

void __thiscall
spdlog::populators::pid_populator::populate(pid_populator *this,log_msg *param_1,json *dest)

{
  value_t t;
  json_value jVar1;
  __pid_t _Var2;
  reference pvVar3;
  json_value local_18;
  
  _Var2 = getpid();
  local_18 = (json_value)(long)_Var2;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)dest,"pid");
  t = pvVar3->m_type;
  pvVar3->m_type = number_integer;
  jVar1 = pvVar3->m_value;
  pvVar3->m_value = local_18;
  local_18 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)&local_18.boolean,t);
  return;
}

Assistant:

SPDLOG_INLINE void pid_populator::populate(const details::log_msg &, nlohmann::json &dest)
{
    dest["pid"] = details::os::pid();
}